

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifier.c
# Opt level: O2

int mpt_identifier_compare(mpt_identifier *id,char *name,int nlen)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  
  if (name == (char *)0x0) {
    if (nlen < 0) {
      return -1;
    }
  }
  else {
    if (id->_charset != '\x01') {
      return -3;
    }
    if (nlen < 0) {
      sVar3 = strlen(name);
      nlen = (int)sVar3;
    }
  }
  uVar1 = id->_len;
  uVar2 = 0;
  if (nlen != 0 || uVar1 != 0) {
    if (nlen + 1U == (uint)uVar1) {
      if (id->_max < uVar1) {
        pcVar7 = id->_base;
      }
      else {
        pcVar7 = id->_val;
      }
      if (name == (char *)0x0) {
        for (lVar6 = 0; uVar2 = 0, lVar6 <= nlen; lVar6 = lVar6 + 1) {
          if (pcVar7[lVar6] != '\0') {
            return (int)lVar6 + 1;
          }
        }
      }
      else {
        uVar4 = 0;
        uVar5 = 0;
        if (0 < nlen) {
          uVar5 = (ulong)(uint)nlen;
        }
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          if (pcVar7[uVar4] != name[uVar4]) {
            return (int)uVar4 + 1;
          }
        }
        uVar2 = 0;
        if (pcVar7[nlen] != '\0') {
          uVar2 = nlen;
        }
      }
    }
    else {
      uVar2 = 0xfffffff0;
    }
  }
  return uVar2;
}

Assistant:

extern int mpt_identifier_compare(const MPT_STRUCT(identifier) *id, const char *name, int nlen)
{
	const char *base = id->_val;
	int i;
	
	if (name && (id->_charset != MPT_CHARSET(UTF8))) {
		return MPT_ERROR(BadType);
	}
	if (nlen < 0) {
		if (!name) {
			return MPT_ERROR(BadArgument);
		}
		nlen = strlen(name);
	}
	if (!nlen && !id->_len) {
		return 0;
	}
	if ((nlen + 1) != id->_len) {
		return MPT_ERROR(MissingData);
	}
	if (id->_len > id->_max) {
		base = id->_base;
	}
	if (!name) {
		for (i = 0; i <= nlen; ++i) {
			if (base[i]) {
				return i + 1;
			}
		}
		return 0;
	}
	for (i = 0; i < nlen; ++i) {
		if (base[i] != name[i]) {
			return i + 1;
		}
	}
	if (base[nlen]) {
		return nlen;
	}
	return 0;
}